

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

ON__UINT64 __thiscall
ON_SerialNumberMap::GarbageCollectMoveHelper
          (ON_SerialNumberMap *this,ON_SN_BLOCK *dst,ON_SN_BLOCK *src)

{
  SN_ELEMENT *pSVar1;
  ON__UINT64 OVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  MAP_VALUE *pMVar5;
  ON__UINT32 OVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  uint uVar9;
  ON__UINT32 OVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  SN_ELEMENT *__src;
  ON__UINT32 *local_38;
  
  if (dst == (ON_SN_BLOCK *)0x0 || src == (ON_SN_BLOCK *)0x0) {
    return 0;
  }
  uVar9 = dst->m_count;
  uVar13 = 0x2000 - uVar9;
  uVar14 = src->m_count;
  uVar12 = uVar13;
  if (uVar14 < uVar13) {
    uVar12 = uVar14;
  }
  if (uVar12 == 0) {
    return 0;
  }
  if (uVar9 == 0) {
    dst->m_purged = 0;
    dst->m_sorted = 1;
    dst->m_sn0 = 0;
    dst->m_sn1 = 0;
    uVar9 = 0;
    if (src->m_sorted == 0) {
      dst->m_sorted = 0;
      OVar2 = src->m_sn1;
      dst->m_sn0 = src->m_sn0;
      dst->m_sn1 = OVar2;
    }
  }
  else if (src->m_sorted == 0) {
    dst->m_sorted = 0;
  }
  local_38 = &src->m_sorted;
  __src = src->m_sn;
  memcpy(dst->m_sn + uVar9,__src,(ulong)uVar12 * 0x38);
  OVar10 = dst->m_count + uVar12;
  dst->m_count = OVar10;
  if (dst->m_sorted == 0) {
    if (src->m_sn0 < dst->m_sn0) {
      dst->m_sn0 = src->m_sn0;
    }
    uVar11 = src->m_sn1;
    if (dst->m_sn1 < uVar11) goto LAB_004d0624;
  }
  else {
    dst->m_sn0 = dst->m_sn[0].m_sn;
    uVar11 = dst->m_sn[OVar10 - 1].m_sn;
LAB_004d0624:
    dst->m_sn1 = uVar11;
  }
  uVar9 = src->m_count;
  if (uVar12 <= uVar9 && uVar9 - uVar12 != 0) {
    if (uVar14 < uVar13) {
      uVar13 = uVar14;
    }
    uVar15 = (ulong)uVar13;
    uVar11 = uVar15;
    do {
      (__src->m_value).m_u = __src[uVar15].m_value.m_u;
      pSVar1 = __src + uVar15;
      uVar14 = (pSVar1->m_id).Data1;
      uVar7 = (pSVar1->m_id).Data2;
      uVar8 = (pSVar1->m_id).Data3;
      uVar3 = *(undefined8 *)(pSVar1->m_id).Data4;
      OVar2 = __src[uVar15].m_sn;
      uVar4 = (&__src[uVar15].m_sn)[1];
      pMVar5 = (MAP_VALUE *)(&__src[uVar15].m_next + 1);
      OVar10 = pMVar5->m_u_type;
      OVar6 = pMVar5->m_u32;
      __src->m_next = __src[uVar15].m_next;
      (__src->m_value).m_u_type = OVar10;
      (__src->m_value).m_u32 = OVar6;
      __src->m_sn = OVar2;
      *(undefined8 *)&__src->m_sn_active = uVar4;
      (__src->m_id).Data1 = uVar14;
      (__src->m_id).Data2 = uVar7;
      (__src->m_id).Data3 = uVar8;
      *(undefined8 *)(__src->m_id).Data4 = uVar3;
      __src = __src + 1;
      uVar14 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar14;
    } while (uVar9 != uVar14);
    src->m_count = uVar9 - uVar12;
    if (uVar9 != uVar12) {
      if (*local_38 != 0) {
        src->m_sn0 = src->m_sn[0].m_sn;
      }
      goto LAB_004d068a;
    }
  }
  src->m_count = 0;
  src->m_purged = 0;
  src->m_sorted = 1;
  src->m_sn0 = 0;
  src->m_sn1 = 0;
LAB_004d068a:
  return (ulong)uVar12;
}

Assistant:

ON__UINT64 ON_SerialNumberMap::GarbageCollectMoveHelper(ON_SN_BLOCK* dst,ON_SN_BLOCK* src)
{
  // This helper is used by GarbageCollectHelper and moves
  // as many entries as possible from src to dst.  
  // Returns: the number of entries transferred.
  ON__UINT32 i,j,n;
  if ( src && dst )
  {
    n = ON_SN_BLOCK::SN_BLOCK_CAPACITY - dst->m_count;
    if ( src->m_count < n )
      n = src->m_count;
    if ( n > 0 )
    {
      if ( 0 == dst->m_count )
      {
        dst->EmptyBlock();
      }
      if ( 0 == src->m_sorted )
      {
        dst->m_sorted = 0;
        if ( 0 == dst->m_count )
        {
          dst->m_sn0 = src->m_sn0;
          dst->m_sn1 = src->m_sn1;
        }
      }
      memcpy(&dst->m_sn[dst->m_count],&src->m_sn[0],(size_t)(n*sizeof(src->m_sn[0])));
      dst->m_count += n;
      if ( dst->m_sorted )
      {
        dst->m_sn0 = dst->m_sn[0].m_sn; // set m_sn0 because input dst could have count 0
        dst->m_sn1 = dst->m_sn[dst->m_count-1].m_sn;
      }
      else 
      {
        if ( dst->m_sn0 > src->m_sn0 )
          dst->m_sn0 = src->m_sn0;
        if ( dst->m_sn1 < src->m_sn1 )
          dst->m_sn1 = src->m_sn1;
      }
      i = 0; j = n;
      while ( j < src->m_count )
      {
        src->m_sn[i++] = src->m_sn[j++];
      }
      src->m_count = i;
      if ( src->m_count > 0 )
      {
        if ( src->m_sorted )
          src->m_sn0 = src->m_sn[0].m_sn;
      }
      else
      {
        src->EmptyBlock();
      }
    }
  }
  else
  {
    n = 0;
  }
  return n;
}